

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  StringPtr *pSVar1;
  Reader value;
  DynamicEnum local_70;
  Maybe<capnp::EnumSchema::Enumerant> local_60;
  
  local_70.schema = input.schema.super_Schema.raw;
  local_70.value = input.value;
  DynamicEnum::getEnumerant(&local_60,&local_70);
  if (local_60.ptr.isSet == true) {
    if ((this->valueToName).size_ <= (ulong)local_60.ptr.field_1.value.ordinal) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x54f,FAILED,"e->getIndex() < valueToName.size()","");
      kj::_::Debug::Fault::fatal((Fault *)&local_60);
    }
    pSVar1 = (this->valueToName).ptr;
    value.super_StringPtr.content.size_ = pSVar1[local_60.ptr.field_1.value.ordinal].content.size_;
    value.super_StringPtr.content.ptr = pSVar1[local_60.ptr.field_1.value.ordinal].content.ptr;
    json::Value::Builder::setString(&output,value);
  }
  else {
    *(undefined2 *)output._builder.data = 2;
    *(double *)((long)output._builder.data + 8) = (double)local_70.value;
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_MAYBE(e, input.getEnumerant()) {
      KJ_ASSERT(e->getIndex() < valueToName.size());
      output.setString(valueToName[e->getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }